

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart_ow.c
# Opt level: O0

mraa_result_t mraa_uart_ow_command(mraa_uart_ow_context dev,uint8_t command,uint8_t *id)

{
  int local_30;
  int i;
  mraa_result_t rv;
  uint8_t *id_local;
  uint8_t command_local;
  mraa_uart_ow_context dev_local;
  
  if (dev == (mraa_uart_ow_context)0x0) {
    syslog(3,"uart_ow: ow_command: context is NULL");
    dev_local._4_4_ = MRAA_ERROR_INVALID_HANDLE;
  }
  else {
    dev_local._4_4_ = mraa_uart_ow_reset(dev);
    if (dev_local._4_4_ == MRAA_SUCCESS) {
      if (id == (uint8_t *)0x0) {
        mraa_uart_ow_write_byte(dev,0xcc);
      }
      else {
        mraa_uart_ow_write_byte(dev,'U');
        for (local_30 = 0; local_30 < 8; local_30 = local_30 + 1) {
          mraa_uart_ow_write_byte(dev,id[local_30]);
        }
      }
      mraa_uart_ow_write_byte(dev,command);
      dev_local._4_4_ = MRAA_SUCCESS;
    }
  }
  return dev_local._4_4_;
}

Assistant:

mraa_result_t
mraa_uart_ow_command(mraa_uart_ow_context dev, uint8_t command, uint8_t* id)
{
    if (!dev) {
        syslog(LOG_ERR, "uart_ow: ow_command: context is NULL");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    /* send reset pulse first */
    mraa_result_t rv = mraa_uart_ow_reset(dev);

    if (rv != MRAA_SUCCESS)
        return rv;

    if (id) {
        /* send the match rom command */
        mraa_uart_ow_write_byte(dev, MRAA_UART_OW_CMD_MATCH_ROM);

        /* sending to a specific device, so send out the full romcode */
        int i;
        for (i = 0; i < MRAA_UART_OW_ROMCODE_SIZE; i++)
            mraa_uart_ow_write_byte(dev, id[i]);
    } else {
        /* send to all devices (or a single device if it's the only one
         * on the bus)
         */
        mraa_uart_ow_write_byte(dev, MRAA_UART_OW_CMD_SKIP_ROM);
    }

    mraa_uart_ow_write_byte(dev, command);

    return MRAA_SUCCESS;
}